

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O0

int kws_search_start(ps_search_t *search)

{
  hmm_t *h;
  hmm_t *hmm;
  kws_search_t *kwss;
  int i;
  ps_search_t *search_local;
  
  *(undefined4 *)&search[1].pls = 0;
  *(undefined4 *)((long)&search[1].config + 4) = 0;
  kws_detections_reset((kws_detections_t *)search[1].name);
  for (kwss._4_4_ = 0; kwss._4_4_ < *(int *)&search[1].dict; kwss._4_4_ = kwss._4_4_ + 1) {
    h = (hmm_t *)((long)search[1].d2p + (long)kwss._4_4_ * 0x58);
    hmm_clear(h);
    hmm_enter(h,0,-1,0);
  }
  ptmr_reset((ptmr_t *)&search[1].hyp_str);
  ptmr_start((ptmr_t *)&search[1].hyp_str);
  return 0;
}

Assistant:

int
kws_search_start(ps_search_t * search)
{
    int i;
    kws_search_t *kwss = (kws_search_t *) search;

    kwss->frame = 0;
    kwss->bestscore = 0;
    kws_detections_reset(kwss->detections);

    /* Reset and enter all phone-loop HMMs. */
    for (i = 0; i < kwss->n_pl; ++i) {
        hmm_t *hmm = (hmm_t *) & kwss->pl_hmms[i];
        hmm_clear(hmm);
        hmm_enter(hmm, 0, -1, 0);
    }

    ptmr_reset(&kwss->perf);
    ptmr_start(&kwss->perf);

    return 0;
}